

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

int Lf_SetAddCut(Lf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  int iVar1;
  Lf_Cut_t *pLVar2;
  Lf_Cut_t *pLVar3;
  bool bVar4;
  int iVar5;
  Lf_Cut_t *t;
  Lf_Cut_t *t_1;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  
  if (nCuts == 0) {
    return 1;
  }
  if (1 < nCuts) {
    bVar4 = false;
    uVar6 = 1;
    do {
      pLVar2 = pCuts[(uint)nCuts];
      uVar7 = *(uint *)&pLVar2->field_0x14 >> 0x18;
      pLVar3 = pCuts[uVar6];
      uVar10 = *(uint *)&pLVar3->field_0x14;
      uVar12 = uVar10 >> 0x18;
      if ((uVar7 < uVar12) && ((pLVar2->Sign & ~pLVar3->Sign) == 0)) {
        if (uVar12 == uVar7) {
          if (0xffffff < uVar10) {
            uVar8 = 0;
            do {
              if (*(int *)((long)&pLVar3[1].Sign + uVar8 * 4) !=
                  *(int *)((long)&pLVar2[1].Sign + uVar8 * 4)) goto LAB_0075e732;
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
          }
        }
        else if (0xffffff < *(uint *)&pLVar2->field_0x14) {
          uVar8 = 0;
          uVar9 = 0;
          do {
            iVar5 = *(int *)((long)&pLVar2[1].Sign + (long)(int)uVar9 * 4);
            iVar1 = *(int *)((long)&pLVar3[1].Sign + uVar8 * 4);
            if (iVar5 < iVar1) break;
            if ((iVar1 == iVar5) && (uVar9 = uVar9 + 1, uVar9 == uVar7)) goto LAB_0075e721;
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
          goto LAB_0075e732;
        }
LAB_0075e721:
        *(uint *)&pLVar3->field_0x14 = uVar10 | 0xff000000;
        bVar4 = true;
      }
LAB_0075e732:
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nCuts);
    if (bVar4) {
      iVar5 = 1;
      uVar6 = 1;
      do {
        if (*(uint *)&pCuts[uVar6]->field_0x14 < 0xff000000) {
          lVar11 = (long)iVar5;
          if (lVar11 < (long)uVar6) {
            pLVar2 = pCuts[lVar11];
            pCuts[lVar11] = pCuts[uVar6];
            pCuts[uVar6] = pLVar2;
          }
          iVar5 = iVar5 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (nCuts + 1 != uVar6);
      nCuts = iVar5 - 1;
    }
  }
  if (nCuts < 1) {
    __assert_fail("nCuts >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,900,"int Lf_SetAddCut(Lf_Cut_t **, int, int)");
  }
  pLVar2 = *pCuts;
  pLVar3 = pCuts[(uint)nCuts];
  if (pLVar3->Delay <= pLVar2->Delay) {
    if (pLVar2->Delay <= pLVar3->Delay) {
      uVar10 = *(uint *)&pLVar2->field_0x14 >> 0x18;
      uVar7 = *(uint *)&pLVar3->field_0x14 >> 0x18;
      if (uVar10 < uVar7) goto LAB_0075e848;
      if (uVar10 <= uVar7) {
        if ((pLVar2->Flow < pLVar3->Flow + -0.005) || (pLVar2->Flow <= pLVar3->Flow + 0.005))
        goto LAB_0075e848;
      }
    }
    *pCuts = pLVar3;
    pCuts[(uint)nCuts] = pLVar2;
    uVar10 = *(uint *)&pLVar3->field_0x14 >> 0x18;
    uVar7 = *(uint *)&pLVar2->field_0x14 >> 0x18;
    if ((uVar10 < uVar7) && ((pLVar3->Sign & ~pLVar2->Sign) == 0)) {
      if (uVar7 == uVar10) {
        if (*(uint *)&pLVar2->field_0x14 < 0x1000000) {
          return nCuts;
        }
        uVar6 = 0;
        while (*(int *)((long)&pLVar2[1].Sign + uVar6 * 4) ==
               *(int *)((long)&pLVar3[1].Sign + uVar6 * 4)) {
          uVar6 = uVar6 + 1;
          if (uVar7 == uVar6) {
            return nCuts;
          }
        }
      }
      else {
        if (*(uint *)&pLVar3->field_0x14 < 0x1000000) {
          return nCuts;
        }
        uVar6 = 0;
        uVar12 = 0;
        do {
          iVar5 = *(int *)((long)&pLVar3[1].Sign + (long)(int)uVar12 * 4);
          iVar1 = *(int *)((long)&pLVar2[1].Sign + uVar6 * 4);
          if (iVar5 < iVar1) break;
          if ((iVar1 == iVar5) && (uVar12 = uVar12 + 1, uVar12 == uVar10)) {
            return nCuts;
          }
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
    }
  }
LAB_0075e848:
  uVar10 = nCuts;
  if (nCuts != 1) {
    while( true ) {
      pLVar2 = pCuts[(ulong)uVar10 - 1];
      pLVar3 = pCuts[uVar10];
      uVar12 = *(uint *)&pLVar2->field_0x14 >> 0x16 & 1;
      uVar7 = *(uint *)&pLVar3->field_0x14 >> 0x16 & 1;
      if (uVar12 < uVar7) break;
      if (uVar12 <= uVar7) {
        if (pLVar2->Flow < pLVar3->Flow + -0.005) break;
        if (pLVar2->Flow <= pLVar3->Flow + 0.005) {
          if ((pLVar2->Delay < pLVar3->Delay) ||
             ((pLVar2->Delay <= pLVar3->Delay &&
              (*(uint *)&pLVar2->field_0x14 >> 0x18 < *(uint *)&pLVar3->field_0x14 >> 0x18))))
          break;
        }
      }
      pCuts[(ulong)uVar10 - 1] = pLVar3;
      pCuts[uVar10] = pLVar2;
      bVar4 = (int)uVar10 < 3;
      uVar10 = uVar10 - 1;
      if (bVar4) break;
    }
  }
  iVar5 = nCutNum + -1;
  if ((int)(nCuts + 1U) < nCutNum + -1) {
    iVar5 = nCuts + 1U;
  }
  return iVar5;
}

Assistant:

static inline int Lf_SetAddCut( Lf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Lf_SetLastCutContainsArea(pCuts, nCuts);
    assert( nCuts >= 1 );
    if ( Lf_CutCompareDelay(pCuts[0], pCuts[nCuts]) == 1 ) // new cut is better for delay
    {
        ABC_SWAP( Lf_Cut_t *, pCuts[0], pCuts[nCuts] );
        // if old cut (now cut number nCuts) is contained - remove it
        if ( pCuts[0]->nLeaves < pCuts[nCuts]->nLeaves && (pCuts[0]->Sign & pCuts[nCuts]->Sign) == pCuts[0]->Sign && Lf_SetCutIsContainedOrder(pCuts[nCuts], pCuts[0]) )
            return nCuts;
    }
    // sort area cuts by area
    Lf_SetSortByArea( pCuts, nCuts );
    // add new cut if there is room
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}